

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O1

int __thiscall duckdb_re2::ByteMapBuilder::Recolor(ByteMapBuilder *this,int oldcolor)

{
  pointer ppVar1;
  pointer ppVar2;
  pointer ppVar3;
  long lVar4;
  int newcolor;
  int local_10;
  int local_c;
  
  ppVar2 = (this->colormap_).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  ppVar1 = (this->colormap_).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar4 = (long)ppVar1 - (long)ppVar2 >> 5;
  ppVar3 = ppVar2;
  if (0 < lVar4) {
    ppVar3 = (pointer)((long)&ppVar2->first + ((long)ppVar1 - (long)ppVar2 & 0xffffffffffffffe0U));
    lVar4 = lVar4 + 1;
    ppVar2 = ppVar2 + 2;
    do {
      if ((ppVar2[-2].first == oldcolor) || (ppVar2[-2].second == oldcolor)) {
        ppVar2 = ppVar2 + -2;
        goto LAB_01ce2cb1;
      }
      if ((ppVar2[-1].first == oldcolor) || (ppVar2[-1].second == oldcolor)) {
        ppVar2 = ppVar2 + -1;
        goto LAB_01ce2cb1;
      }
      if ((ppVar2->first == oldcolor) || (ppVar2->second == oldcolor)) goto LAB_01ce2cb1;
      if ((ppVar2[1].first == oldcolor) || (ppVar2[1].second == oldcolor)) {
        ppVar2 = ppVar2 + 1;
        goto LAB_01ce2cb1;
      }
      lVar4 = lVar4 + -1;
      ppVar2 = ppVar2 + 4;
    } while (1 < lVar4);
  }
  lVar4 = (long)ppVar1 - (long)ppVar3 >> 3;
  if (lVar4 != 1) {
    ppVar2 = ppVar3;
    if (lVar4 != 2) {
      ppVar2 = ppVar1;
      if (((lVar4 != 3) || (ppVar2 = ppVar3, ppVar3->first == oldcolor)) ||
         (ppVar3->second == oldcolor)) goto LAB_01ce2cb1;
      ppVar2 = ppVar3 + 1;
    }
    if ((ppVar2->first == oldcolor) || (ppVar2->second == oldcolor)) goto LAB_01ce2cb1;
    ppVar3 = ppVar2 + 1;
  }
  ppVar2 = ppVar1;
  if (ppVar3->second == oldcolor) {
    ppVar2 = ppVar3;
  }
  if (ppVar3->first == oldcolor) {
    ppVar2 = ppVar3;
  }
LAB_01ce2cb1:
  if (ppVar2 == ppVar1) {
    local_c = this->nextcolor_;
    this->nextcolor_ = local_c + 1;
    local_10 = oldcolor;
    std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int&,int&>
              ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&this->colormap_,
               &local_10,&local_c);
  }
  else {
    local_c = ppVar2->second;
  }
  return local_c;
}

Assistant:

int ByteMapBuilder::Recolor(int oldcolor) {
  // Yes, this is a linear search. There can be at most 256
  // colors and there will typically be far fewer than that.
  // Also, we need to consider keys *and* values in order to
  // avoid recoloring a given range more than once per batch.
  std::vector<std::pair<int, int>>::const_iterator it =
      std::find_if(colormap_.begin(), colormap_.end(),
                   [=](const std::pair<int, int>& kv) -> bool {
                     return kv.first == oldcolor || kv.second == oldcolor;
                   });
  if (it != colormap_.end())
    return it->second;
  int newcolor = nextcolor_;
  nextcolor_++;
  colormap_.emplace_back(oldcolor, newcolor);
  return newcolor;
}